

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1352d2::CommandTask::provideValue
          (CommandTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,ValueType *valueData)

{
  Command *pCVar1;
  BuildSystem *pBVar2;
  TaskInterface ti_00;
  BuildSystemImpl *pBVar3;
  void *in_stack_ffffffffffffff48;
  BuildValue local_a0;
  
  pCVar1 = this->command;
  ti_00.ctx = (void *)inputID;
  ti_00.impl = in_stack_ffffffffffffff48;
  pBVar3 = getBuildSystem(ti_00);
  pBVar2 = pBVar3->buildSystem;
  llbuild::buildsystem::BuildValue::fromData(&local_a0,valueData);
  (*(pCVar1->super_JobDescriptor)._vptr_JobDescriptor[0x11])
            (pCVar1,pBVar2,ti.impl,ti.ctx,inputID,key,&local_a0);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_a0);
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    command.provideValue(getBuildSystem(ti).getBuildSystem(), ti, inputID,
                         key, BuildValue::fromData(valueData));
  }